

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpinfo.c
# Opt level: O0

char * yabmp_basename(char *path)

{
  bool bVar1;
  uint local_1c;
  char *pcStack_18;
  int l_offset;
  char *l_firstResult;
  char *path_local;
  
  pcStack_18 = strrchr(path,0x2f);
  bVar1 = pcStack_18 == (char *)0x0;
  if (bVar1) {
    pcStack_18 = path;
  }
  local_1c = (uint)!bVar1;
  return pcStack_18 + (int)local_1c;
}

Assistant:

static const char* yabmp_basename(const char* path)
{
	const char* l_firstResult = NULL;
	int l_offset = 1;
	
	l_firstResult = strrchr(path, '/');
	if (l_firstResult == NULL) {
		l_firstResult = path;
		l_offset = 0;
	}
#if defined(WIN32)
	{
		const char* l_secondResult = strrchr(l_firstResult, '\\');
		if(l_secondResult != NULL) {
			l_firstResult = l_secondResult;
			l_offset = 1;
		}
	}
#endif
	return l_firstResult + l_offset;
}